

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlDocPtr
htmlCtxtReadIO(htmlParserCtxtPtr ctxt,xmlInputReadCallback ioread,xmlInputCloseCallback ioclose,
              void *ioctx,char *URL,char *encoding,int options)

{
  xmlParserInputBufferPtr input;
  xmlParserInputPtr value;
  htmlDocPtr pxVar1;
  
  if (ctxt != (htmlParserCtxtPtr)0x0 && ioread != (xmlInputReadCallback)0x0) {
    xmlInitParser();
    htmlCtxtReset(ctxt);
    input = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,XML_CHAR_ENCODING_NONE);
    if (input == (xmlParserInputBufferPtr)0x0) {
      if (ioclose != (xmlInputCloseCallback)0x0) {
        (*ioclose)(ioctx);
      }
    }
    else {
      value = xmlNewIOInputStream(ctxt,input,XML_CHAR_ENCODING_NONE);
      if (value != (xmlParserInputPtr)0x0) {
        inputPush(ctxt,value);
        pxVar1 = htmlDoRead(ctxt,URL,encoding,options,1);
        return pxVar1;
      }
      xmlFreeParserInputBuffer(input);
    }
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlCtxtReadIO(htmlParserCtxtPtr ctxt, xmlInputReadCallback ioread,
              xmlInputCloseCallback ioclose, void *ioctx,
	      const char *URL,
              const char *encoding, int options)
{
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (ioread == NULL)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    htmlCtxtReset(ctxt);

    input = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx,
                                         XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (NULL);
    }
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (htmlDoRead(ctxt, URL, encoding, options, 1));
}